

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O2

bsc_step_t
bsc_bcast_qtree_single
          (bsc_step_t depends,bsp_pid_t root,bsc_group_t group,void *src,void *dst,bsc_size_t size,
          bsc_pid_t q)

{
  long lVar1;
  bsp_pid_t bVar2;
  int iVar3;
  bsc_pid_t dst_pid;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 local_50;
  undefined4 local_48;
  
  if (group == (bsc_group_t)0x0) {
    iVar3 = bsp_nprocs();
    iVar5 = bsp_pid();
  }
  else {
    iVar3 = *group;
    lVar1 = *(long *)((long)group + 8);
    root = *(int *)(lVar1 + (long)root * 4);
    bVar2 = bsp_pid();
    iVar5 = *(int *)(lVar1 + (long)bVar2 * 4);
  }
  local_48 = ((iVar3 - root) + iVar5) % iVar3;
  if ((dst != src) && (local_48 == 0)) {
    memcpy(dst,src,(long)size);
  }
  local_50 = depends;
  for (iVar5 = 1; iVar5 < iVar3; iVar5 = iVar5 * q) {
    if (local_48 < iVar5) {
      iVar4 = local_48;
      for (iVar6 = 1; iVar4 = iVar4 + iVar5, iVar6 < q; iVar6 = iVar6 + 1) {
        if (iVar4 < iVar3) {
          dst_pid = (root + iVar4) % iVar3;
          if (group != (bsc_group_t)0x0) {
            dst_pid = *(bsc_pid_t *)(*(long *)((long)group + 0x10) + (long)dst_pid * 4);
          }
          bsc_put(local_50,dst_pid,dst,dst,0,size);
        }
      }
    }
    local_50 = local_50 + 1;
  }
  return local_50;
}

Assistant:

DLL_PUBLIC bsc_step_t bsc_bcast_qtree_single( bsc_step_t depends,
                      bsp_pid_t root, bsc_group_t group, 
                      const void * src, void * dst, bsc_size_t size,
                      bsc_pid_t q )
{
    const group_t * g = group;
    bsc_pid_t i, j, P = g?g->size:bsp_nprocs() ;
    bsc_pid_t range, r = g?g->lid[root]:root;
    bsc_pid_t me = ((g?g->lid[ bsp_pid() ] : bsp_pid()) + P - r) %P;

    if ( me == 0 && dst != src ) 
        memcpy( dst, src, size ); 

    for (range = 1; range < P; range *= q ) {
        if ( me < range ) {
            for ( i = 1 ; i < q; ++i) {
                j = i * range + me; 
                if (j < P) {
                    j = ( j + r ) % P;
                    bsc_put( depends, g?g->gid[j]:j, dst, dst, 0, size );
                }
            }
        }
        depends += 1;
    }
    return depends;
}